

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h262_slice.c
# Opt level: O0

int h262_slice(bitstream *str,h262_seqparm *seqparm,h262_picparm *picparm,h262_slice *slice)

{
  int iVar1;
  bool bVar2;
  uint local_40;
  uint32_t local_3c;
  uint32_t curr_mb_addr;
  uint32_t qsc;
  uint32_t tmp;
  uint32_t tmp_1;
  h262_slice *slice_local;
  h262_picparm *picparm_local;
  h262_seqparm *seqparm_local;
  bitstream *str_local;
  
  _tmp = slice;
  slice_local = (h262_slice *)picparm;
  picparm_local = (h262_picparm *)seqparm;
  seqparm_local = (h262_seqparm *)str;
  iVar1 = vs_u(str,&slice->quantiser_scale_code,5);
  if ((iVar1 == 0) &&
     (iVar1 = vs_u((bitstream *)seqparm_local,&_tmp->intra_slice_flag,1), iVar1 == 0)) {
    if (_tmp->intra_slice_flag == 0) {
LAB_00105699:
      curr_mb_addr = _tmp->first_mb_in_slice % slice_local[0x25].slice_vertical_position;
      iVar1 = h262_mb_addr_inc((bitstream *)seqparm_local,&curr_mb_addr);
      if (iVar1 == 0) {
        if (curr_mb_addr < slice_local[0x25].slice_vertical_position) {
          _tmp->first_mb_in_slice =
               _tmp->slice_vertical_position * slice_local[0x25].slice_vertical_position +
               curr_mb_addr;
          local_3c = _tmp->quantiser_scale_code;
          local_40 = _tmp->first_mb_in_slice;
          do {
            while( true ) {
              iVar1 = h262_macroblock((bitstream *)seqparm_local,(h262_seqparm *)picparm_local,
                                      (h262_picparm *)slice_local,_tmp->mbs + local_40,&local_3c);
              if (iVar1 != 0) {
                return 1;
              }
              if (seqparm_local->horizontal_size != 1) break;
              _tmp->last_mb_in_slice = local_40;
              local_40 = local_40 + 1;
              iVar1 = vs_has_more_data((bitstream *)seqparm_local);
              if (iVar1 == 0) {
                return 0;
              }
              iVar1 = h262_mb_addr_inc((bitstream *)seqparm_local,&curr_mb_addr);
              if (iVar1 != 0) {
                return 1;
              }
              if (slice_local[0x25].intra_slice_flag <= local_40) {
                fprintf(_stderr,"MB index overflow\n");
                return 1;
              }
              for (; curr_mb_addr != 0; curr_mb_addr = curr_mb_addr - 1) {
                _tmp->mbs[local_40].macroblock_skipped = 1;
                _tmp->mbs[local_40].macroblock_quant = 0;
                _tmp->mbs[local_40].macroblock_motion_forward = 0;
                _tmp->mbs[local_40].macroblock_motion_backward = 0;
                _tmp->mbs[local_40].macroblock_pattern = 0;
                _tmp->mbs[local_40].macroblock_intra = 0;
                iVar1 = h262_infer_vectors((bitstream *)seqparm_local,(h262_seqparm *)picparm_local,
                                           (h262_picparm *)slice_local,_tmp->mbs + local_40,0);
                if (iVar1 != 0) {
                  return 1;
                }
                iVar1 = h262_infer_vectors((bitstream *)seqparm_local,(h262_seqparm *)picparm_local,
                                           (h262_picparm *)slice_local,_tmp->mbs + local_40,1);
                if (iVar1 != 0) {
                  return 1;
                }
                local_40 = local_40 + 1;
                if (slice_local[0x25].intra_slice_flag <= local_40) {
                  fprintf(_stderr,"MB index overflow\n");
                  return 1;
                }
              }
            }
            if (_tmp->last_mb_in_slice == local_40) {
              return 0;
            }
            curr_mb_addr = 0;
            while( true ) {
              bVar2 = false;
              if (_tmp->last_mb_in_slice != local_40) {
                bVar2 = _tmp->mbs[local_40].macroblock_skipped != 0;
              }
              if (!bVar2) break;
              curr_mb_addr = curr_mb_addr + 1;
              local_40 = local_40 + 1;
            }
            if (_tmp->last_mb_in_slice == local_40) {
              fprintf(_stderr,"Last MB in slice is skipped\n");
              return 1;
            }
            iVar1 = h262_mb_addr_inc((bitstream *)seqparm_local,&curr_mb_addr);
          } while (iVar1 == 0);
        }
        else {
          fprintf(_stderr,"Initial mb_addr_inc too large\n");
        }
      }
    }
    else {
      iVar1 = vs_u((bitstream *)seqparm_local,&_tmp->intra_slice,1);
      if (iVar1 == 0) {
        qsc = 0;
        iVar1 = vs_u((bitstream *)seqparm_local,&qsc,8);
        while (iVar1 == 0) {
          if ((qsc & 1) == 0) goto LAB_00105699;
          iVar1 = vs_u((bitstream *)seqparm_local,&qsc,9);
        }
      }
    }
  }
  return 1;
}

Assistant:

int h262_slice(struct bitstream *str, struct h262_seqparm *seqparm, struct h262_picparm *picparm, struct h262_slice *slice) {
	if (vs_u(str, &slice->quantiser_scale_code, 5))
		return 1;
	if (vs_u(str, &slice->intra_slice_flag, 1)) return 1;
	if (slice->intra_slice_flag) {
		if (vs_u(str, &slice->intra_slice, 1)) return 1;
		uint32_t tmp = 0;
		if (vs_u(str, &tmp, 8)) return 1;
		while(tmp & 1) {
			if (vs_u(str, &tmp, 9)) return 1;
		}
	}
	uint32_t tmp = slice->first_mb_in_slice % picparm->pic_width_in_mbs;
	if (h262_mb_addr_inc(str, &tmp)) return 1;
	if (tmp >= picparm->pic_width_in_mbs) {
		fprintf(stderr, "Initial mb_addr_inc too large\n");
		return 1;
	}
	slice->first_mb_in_slice = slice->slice_vertical_position * picparm->pic_width_in_mbs + tmp;
	uint32_t qsc = slice->quantiser_scale_code;
	uint32_t curr_mb_addr = slice->first_mb_in_slice;
	while (1) {
		if (h262_macroblock(str, seqparm, picparm, &slice->mbs[curr_mb_addr], &qsc)) return 1;
		if (str->dir == VS_DECODE) {
			slice->last_mb_in_slice = curr_mb_addr;
			curr_mb_addr++;
			if (!vs_has_more_data(str))
				return 0;
			if (h262_mb_addr_inc(str, &tmp)) return 1;
			if (curr_mb_addr >= picparm->pic_size_in_mbs) {
				fprintf(stderr, "MB index overflow\n");
				return 1;
			}
			while (tmp) {
				slice->mbs[curr_mb_addr].macroblock_skipped = 1;
				slice->mbs[curr_mb_addr].macroblock_quant = 0;
				slice->mbs[curr_mb_addr].macroblock_motion_forward = 0;
				slice->mbs[curr_mb_addr].macroblock_motion_backward = 0;
				slice->mbs[curr_mb_addr].macroblock_pattern = 0;
				slice->mbs[curr_mb_addr].macroblock_intra = 0;
				if (h262_infer_vectors(str, seqparm, picparm, &slice->mbs[curr_mb_addr], 0)) return 1;
				if (h262_infer_vectors(str, seqparm, picparm, &slice->mbs[curr_mb_addr], 1)) return 1;
				curr_mb_addr++;
				if (curr_mb_addr >= picparm->pic_size_in_mbs) {
					fprintf(stderr, "MB index overflow\n");
					return 1;
				}
				tmp--;
			}
		} else {
			if (slice->last_mb_in_slice == curr_mb_addr) {
				return 0;
			}
			tmp = 0;
			while (slice->last_mb_in_slice != curr_mb_addr && slice->mbs[curr_mb_addr].macroblock_skipped) {
				tmp++;
				curr_mb_addr++;
			}
			if (slice->last_mb_in_slice == curr_mb_addr) {
				fprintf(stderr, "Last MB in slice is skipped\n");
				return 1;
			}
			if (h262_mb_addr_inc(str, &tmp)) return 1;
		}
	}
	return 0;
}